

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalSet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  char *pcVar2;
  int __c;
  Var local_88;
  Enum local_3c;
  undefined1 local_38 [8];
  GlobalType global_type;
  Var *global_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  unique0x1000016d = global_var;
  Opcode::Opcode((Opcode *)&global_type.type.type_index_,GlobalSet);
  this_local._4_4_ = CheckInstr(this,(Opcode)global_type.type.type_index_,loc);
  GlobalType::GlobalType((GlobalType *)local_38);
  Var::Var(&local_88,global_var);
  local_3c = (Enum)CheckGlobalIndex(this,&local_88,(GlobalType *)local_38);
  pcVar2 = (char *)(ulong)local_3c;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
  Var::~Var(&local_88);
  if (((undefined1)global_type.type.enum_ & ~I64) == Any) {
    pcVar2 = Var::index(global_var,pcVar2,__c);
    RVar1 = PrintError(this,loc,"can\'t global.set on immutable global at index %u.",
                       (ulong)pcVar2 & 0xffffffff);
    Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  }
  RVar1 = TypeChecker::OnGlobalSet(&this->typechecker_,(Type)local_38);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalSet(const Location& loc, Var global_var) {
  Result result = CheckInstr(Opcode::GlobalSet, loc);
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  if (!global_type.mutable_) {
    result |= PrintError(
        loc, "can't global.set on immutable global at index %" PRIindex ".",
        global_var.index());
  }
  result |= typechecker_.OnGlobalSet(global_type.type);
  return result;
}